

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

void __thiscall ObjLoader::parseFile(ObjLoader *this,string *filename)

{
  pointer *ppaVar1;
  pointer *ppfVar2;
  pointer *this_00;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *this_01;
  bool bVar3;
  bool bVar4;
  char *filename_00;
  char *mtl_basedir;
  ostream *this_02;
  material_t *pmVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_03;
  reference v0_00;
  reference v1_00;
  vec<3,_float,_(glm::qualifier)0> *v_00;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this_04;
  vec<3,_float,_(glm::qualifier)0> vVar11;
  vec3 vVar12;
  string *local_8f0;
  string *local_8e0;
  string *local_8d0;
  undefined1 local_858 [8];
  vec3 normal;
  vec3 *v2;
  vec3 *v1;
  vec3 *v0;
  size_t nbVertices;
  vec<4,_float,_(glm::qualifier)0> local_820;
  undefined4 local_810;
  float local_80c;
  real_t cA;
  real_t cB;
  real_t cG;
  real_t cR;
  vec<2,_float,_(glm::qualifier)0> local_7f8;
  float local_7f0;
  float local_7ec;
  real_t ty;
  real_t tx;
  float local_7e0;
  vec<3,_float,_(glm::qualifier)0> local_7d4;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_7c8;
  float local_7bc;
  float local_7b8;
  real_t nz;
  real_t ny;
  real_t nx;
  float local_7a4;
  float local_7a0;
  real_t vz;
  real_t vy;
  real_t vx;
  index_t idx;
  size_t v;
  ulong uStack_778;
  int current_material_id;
  size_t f;
  size_t s;
  string local_748;
  string local_728;
  undefined1 local_708 [8];
  SimpleMaterial material;
  material_t *mp;
  size_t m;
  material_t defaultMaterial;
  undefined1 local_c8 [7];
  bool ret;
  string err;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t attrib;
  string *filename_local;
  ObjLoader *this_local;
  
  ppaVar1 = &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)filename;
  tinyobj::attrib_t::attrib_t(ppaVar1);
  this_00 = &materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::vector
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)this_00);
  this_01 = (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
            ((long)&err.field_2 + 8);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::vector(this_01);
  std::__cxx11::string::string((string *)local_c8);
  filename_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  mtl_basedir = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str(&this->m_rootDir);
  bVar3 = tinyobj::LoadObj((attrib_t *)ppaVar1,
                           (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)this_00,
                           this_01,(string *)local_c8,filename_00,mtl_basedir,true);
  bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  if (!bVar4) {
    this_02 = std::operator<<((ostream *)&std::cerr,(string *)local_c8);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  }
  if (!bVar3) {
    exit(1);
  }
  tinyobj::anon_struct_1392_47_816f60ef::material_t((anon_struct_1392_47_816f60ef *)&m);
  defaultMaterial.ambient[0] = 0.1;
  defaultMaterial.name.field_2._12_4_ = 0x3dcccccd;
  defaultMaterial.name.field_2._8_4_ = 0x3dcccccd;
  defaultMaterial.diffuse[0] = 0.3;
  defaultMaterial.ambient[2] = 0.3;
  defaultMaterial.ambient[1] = 0.3;
  defaultMaterial.specular[0] = 0.2;
  defaultMaterial.diffuse[2] = 0.2;
  defaultMaterial.diffuse[1] = 0.2;
  defaultMaterial.emission[1] = 1.0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
             "default_material");
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
             ((long)&err.field_2 + 8),(value_type *)&m);
  mp = (material_t *)0x0;
  while( true ) {
    pmVar5 = (material_t *)
             std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                       ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                        ((long)&err.field_2 + 8));
    if (pmVar5 <= mp) break;
    material.specularTexName.field_2._8_8_ =
         std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::operator[]
                   ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                    ((long)&err.field_2 + 8),(size_type)mp);
    SimpleMaterial::SimpleMaterial((SimpleMaterial *)local_708);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               material.specularTexName.field_2._8_8_);
    material.ambient.field_0.field_0.x = *(float *)(material.specularTexName.field_2._8_8_ + 0x28);
    material.name.field_2._8_8_ = *(undefined8 *)(material.specularTexName.field_2._8_8_ + 0x20);
    material.diffuse.field_0.field_0.x = *(float *)(material.specularTexName.field_2._8_8_ + 0x34);
    material.ambient.field_0._4_8_ = *(undefined8 *)(material.specularTexName.field_2._8_8_ + 0x2c);
    material.specular.field_0.field_0.x = *(float *)(material.specularTexName.field_2._8_8_ + 0x40);
    material.diffuse.field_0._4_8_ = *(undefined8 *)(material.specularTexName.field_2._8_8_ + 0x38);
    material.specular.field_0.field_0.y = *(float *)(material.specularTexName.field_2._8_8_ + 0x5c);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (material.specularTexName.field_2._8_8_ + 0x90),"");
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_8d0 = &defaultDiffuseName_abi_cxx11_;
    }
    else {
      local_8d0 = (string *)(material.specularTexName.field_2._8_8_ + 0x90);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&material.specular.field_0 + 8),local_8d0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (material.specularTexName.field_2._8_8_ + 0x3f0),"");
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_8e0 = &defaultNormalName_abi_cxx11_;
    }
    else {
      local_8e0 = (string *)(material.specularTexName.field_2._8_8_ + 0x3f0);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&material.diffuseTexName.field_2 + 8),local_8e0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (material.specularTexName.field_2._8_8_ + 0x3f0),"");
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_8f0 = &defaultDiffuseName_abi_cxx11_;
    }
    else {
      local_8f0 = (string *)(material.specularTexName.field_2._8_8_ + 0xb0);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&material.normalTexName.field_2 + 8),local_8f0);
    std::__cxx11::string::string
              ((string *)&local_728,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (material.specularTexName.field_2._8_8_ + 0x90));
    loadImage(this,&local_728);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::string
              ((string *)&local_748,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (material.specularTexName.field_2._8_8_ + 0x3f0));
    loadImage(this,&local_748);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::string
              ((string *)&s,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (material.specularTexName.field_2._8_8_ + 0xb0));
    loadImage(this,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::push_back
              (&this->m_materials,(value_type *)local_708);
    SimpleMaterial::~SimpleMaterial((SimpleMaterial *)local_708);
    mp = (material_t *)((long)&(mp->name)._M_dataplus._M_p + 1);
  }
  sVar6 = std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::size(&this->m_materials);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->m_ibos,sVar6);
  f = 0;
  do {
    sVar6 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::size
                      ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                       &materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar6 <= f) {
      computeTangents(this);
      cleanUpDuplicates(this);
      tinyobj::anon_struct_1392_47_816f60ef::~material_t((anon_struct_1392_47_816f60ef *)&m);
      std::__cxx11::string::~string((string *)local_c8);
      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                 ((long)&err.field_2 + 8));
      std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector
                ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                 &materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      tinyobj::attrib_t::~attrib_t
                (&shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    uStack_778 = 0;
    while( true ) {
      pvVar7 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                         ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                          &materials.
                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,f);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&(pvVar7->mesh).num_face_vertices);
      if (sVar6 <= uStack_778) break;
      pvVar7 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                         ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                          &materials.
                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,f);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(pvVar7->mesh).material_ids,uStack_778);
      v._4_4_ = *pvVar8;
      if (v._4_4_ < 0) {
LAB_0013dc06:
        sVar6 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                          ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                           ((long)&err.field_2 + 8));
        v._4_4_ = (int)sVar6 + -1;
      }
      else {
        sVar6 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                          ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                           ((long)&err.field_2 + 8));
        if ((int)sVar6 <= v._4_4_) goto LAB_0013dc06;
      }
      for (stack0xfffffffffffff878 = 0; stack0xfffffffffffff878 < 3;
          register0x00000000 = stack0xfffffffffffff878 + 1) {
        pvVar7 = std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::operator[]
                           ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
                            &materials.
                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,f);
        pvVar9 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::operator[]
                           (&(pvVar7->mesh).indices,uStack_778 * 3 + stack0xfffffffffffff878);
        idx.vertex_index = pvVar9->texcoord_index;
        vy = (real_t)pvVar9->vertex_index;
        vx = (real_t)pvVar9->normal_index;
        ppaVar1 = &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)ppaVar1,(long)((int)vy * 3));
        vz = *pvVar10;
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)ppaVar1,
                             (long)((int)vy * 3 + 1));
        local_7a0 = *pvVar10;
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)ppaVar1,
                             (long)((int)vy * 3 + 2));
        local_7a4 = *pvVar10;
        glm::vec<3,_float,_(glm::qualifier)0>::vec
                  ((vec<3,_float,_(glm::qualifier)0> *)&ny,vz,local_7a0,local_7a4);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&this->m_vertexPositions,(value_type *)&ny);
        sVar6 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)
                           &attrib.vertices.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar6 != 0) {
          ppfVar2 = &attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,(long)((int)vx * 3))
          ;
          nz = *pvVar10;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,
                               (long)((int)vx * 3 + 1));
          local_7b8 = *pvVar10;
          v_00 = (vec<3,_float,_(glm::qualifier)0> *)(long)((int)vx * 3 + 2);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,(size_type)v_00);
          local_7bc = *pvVar10;
          glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_7d4,nz,local_7b8,local_7bc);
          vVar11 = glm::operator-((glm *)&local_7d4,v_00);
          local_7e0 = vVar11.field_0._8_4_;
          _ty = vVar11.field_0._0_8_;
          local_7c8._0_8_ = _ty;
          local_7c8.field_0.z = local_7e0;
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::push_back(&this->m_vertexNormals,(value_type *)&local_7c8.field_0);
        }
        sVar6 = std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)
                           &attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage);
        if (sVar6 == 0) {
          glm::vec<2,float,(glm::qualifier)0>::vec<int,int>
                    ((vec<2,float,(glm::qualifier)0> *)&cG,0,0);
          std::
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ::push_back(&this->m_vertexUVs,(value_type *)&cG);
        }
        else {
          ppfVar2 = &attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,
                               (long)(idx.vertex_index * 2));
          local_7ec = *pvVar10;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)ppfVar2,
                               (long)(idx.vertex_index * 2 + 1));
          local_7f0 = *pvVar10;
          glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_7f8,local_7ec,local_7f0);
          std::
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ::push_back(&this->m_vertexUVs,&local_7f8);
        }
        ppfVar2 = &attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)ppfVar2,(long)((int)vy * 3));
        cB = *pvVar10;
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)ppfVar2,
                             (long)((int)vy * 3 + 1));
        cA = *pvVar10;
        pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)ppfVar2,
                             (long)((int)vy * 3 + 2));
        local_80c = *pvVar10;
        local_810 = 0x3f800000;
        glm::vec<4,_float,_(glm::qualifier)0>::vec(&local_820,cB,cA,local_80c,1.0);
        std::
        vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
        ::push_back(&this->m_vertexColors,&local_820);
        this_03 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](&this->m_ibos,(long)v._4_4_);
        sVar6 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::size(&this->m_vertexPositions);
        nbVertices._4_4_ = (int)sVar6 + -1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_03,(value_type_conflict1 *)((long)&nbVertices + 4));
      }
      sVar6 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)
                         &attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if (sVar6 == 0) {
        this_04 = &this->m_vertexPositions;
        sVar6 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::size(this_04);
        v0_00 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::operator[](this_04,sVar6 - 3);
        v1_00 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::operator[](this_04,sVar6 - 2);
        register0x00000000 =
             std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[](this_04,sVar6 - 1);
        vVar12 = calcNormal(v0_00,v1_00,register0x00000000);
        normal.field_0.field_0.x = (float)vVar12.field_0._8_4_;
        local_858 = vVar12.field_0._0_8_;
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&this->m_vertexNormals,(value_type *)local_858);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&this->m_vertexNormals,(value_type *)local_858);
        std::
        vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ::push_back(&this->m_vertexNormals,(value_type *)local_858);
      }
      uStack_778 = uStack_778 + 1;
    }
    f = f + 1;
  } while( true );
}

Assistant:

void ObjLoader::parseFile(const std::string & filename)
{
  tinyobj::attrib_t attrib;
  std::vector<tinyobj::shape_t> shapes;
  std::vector<tinyobj::material_t> materials;
  std::string err;
  bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &err, filename.c_str(), m_rootDir.c_str());
  if (!err.empty()) {
    std::cerr << err << std::endl;
  }
  if (!ret) {
    exit(1);
  }

  // Loop over materials
  tinyobj::material_t defaultMaterial;
  defaultMaterial.ambient[0] = defaultMaterial.ambient[1] = defaultMaterial.ambient[2] = 0.1;
  defaultMaterial.diffuse[0] = defaultMaterial.diffuse[1] = defaultMaterial.diffuse[2] = 0.3;
  defaultMaterial.specular[0] = defaultMaterial.specular[1] = defaultMaterial.specular[2] = 0.2;
  defaultMaterial.shininess = 1;
  defaultMaterial.name = "default_material";
  materials.push_back(defaultMaterial);
  for (size_t m = 0; m < materials.size(); m++) {
    tinyobj::material_t * mp = &materials[m];
    SimpleMaterial material;
    material.name = mp->name;
    material.ambient = *reinterpret_cast<glm::vec3 *>(mp->ambient);
    material.diffuse = *reinterpret_cast<glm::vec3 *>(mp->diffuse);
    material.specular = *reinterpret_cast<glm::vec3 *>(mp->specular);
    material.shininess = mp->shininess;
    material.diffuseTexName = (mp->diffuse_texname != "") ? mp->diffuse_texname : defaultDiffuseName;
    material.normalTexName = (mp->normal_texname != "") ? mp->normal_texname : defaultNormalName;
    material.specularTexName = (mp->normal_texname != "") ? mp->specular_texname : defaultDiffuseName;
    loadImage(mp->diffuse_texname);
    loadImage(mp->normal_texname);
    loadImage(mp->specular_texname);
    m_materials.push_back(material);
  }

  m_ibos.resize(m_materials.size());
  // Loop over shapes
  for (size_t s = 0; s < shapes.size(); s++) {
    // Loop over faces(polygon)
    for (size_t f = 0; f < shapes[s].mesh.num_face_vertices.size(); f++) {
      int current_material_id = shapes[s].mesh.material_ids[f];
      if ((current_material_id < 0) || (current_material_id >= static_cast<int>(materials.size()))) {
        // Invalid material ID. Use default material.
        current_material_id = materials.size() - 1; // Default material is added to the last item in `materials`.
      }

      // Loop over vertices in the face.
      for (size_t v = 0; v < 3; v++) {
        // access to vertex
        tinyobj::index_t idx = shapes[s].mesh.indices[3 * f + v];
        tinyobj::real_t vx = attrib.vertices[3 * idx.vertex_index + 0];
        tinyobj::real_t vy = attrib.vertices[3 * idx.vertex_index + 1];
        tinyobj::real_t vz = attrib.vertices[3 * idx.vertex_index + 2];
        m_vertexPositions.push_back(glm::vec3(vx, vy, vz));

        if (attrib.normals.size() > 0) {
          tinyobj::real_t nx = attrib.normals[3 * idx.normal_index + 0];
          tinyobj::real_t ny = attrib.normals[3 * idx.normal_index + 1];
          tinyobj::real_t nz = attrib.normals[3 * idx.normal_index + 2];
          m_vertexNormals.push_back(-glm::vec3(nx, ny, nz));
        }
        if (attrib.texcoords.size() > 0) {
          tinyobj::real_t tx = attrib.texcoords[2 * idx.texcoord_index + 0];
          tinyobj::real_t ty = attrib.texcoords[2 * idx.texcoord_index + 1];
          m_vertexUVs.push_back(glm::vec2(tx, ty));
        } else {
          m_vertexUVs.push_back({0, 0});
        }
        //! note: beware attrib.colors is not empty even if no colors were specified (it is filled with black colors)
        tinyobj::real_t cR = attrib.colors[3 * idx.vertex_index + 0];
        tinyobj::real_t cG = attrib.colors[3 * idx.vertex_index + 1];
        tinyobj::real_t cB = attrib.colors[3 * idx.vertex_index + 2];
        tinyobj::real_t cA = 1;
        m_vertexColors.push_back(glm::vec4(cR, cG, cB, cA));
        m_ibos[current_material_id].push_back(m_vertexPositions.size() - 1);
      }

      // Compute the geometric normal if not specified.
      if (attrib.normals.size() == 0) {
        size_t nbVertices = m_vertexPositions.size();
        const glm::vec3 & v0 = m_vertexPositions[nbVertices - 3];
        const glm::vec3 & v1 = m_vertexPositions[nbVertices - 2];
        const glm::vec3 & v2 = m_vertexPositions[nbVertices - 1];
        glm::vec3 normal = calcNormal(v0, v1, v2);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
      }
    }
  }
  computeTangents();
  cleanUpDuplicates();
}